

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O0

void anon_unknown.dwarf_2321f3::fillPixels4
               (Array2D<unsigned_int> *pi,Array2D<Imath_3_2::half> *ph,Array2D<float> *pf,int width,
               int height)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *this;
  long lVar4;
  uint *puVar5;
  half *phVar6;
  float *pfVar7;
  int in_ECX;
  Array2D<float> *in_RDX;
  Array2D<Imath_3_2::half> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  int in_R8D;
  anon_union_4_2_947300a4 u;
  int x;
  int y;
  Rand48 rand;
  unsigned_long in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  byte in_stack_ffffffffffffffb7;
  bool local_41;
  int local_30;
  int local_2c;
  
  this = std::operator<<((ostream *)&std::cout,"random bits");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  for (local_2c = 0; local_2c < in_R8D; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
      lVar4 = Imath_3_2::Rand48::nexti((Rand48 *)0x207e22);
      puVar5 = Imf_3_4::Array2D<unsigned_int>::operator[](in_RDI,(long)local_2c);
      puVar5[local_30] = (uint)lVar4;
      do {
        phVar6 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](in_RSI,(long)local_2c);
        lVar4 = Imath_3_2::Rand48::nexti((Rand48 *)0x207e6a);
        Imath_3_2::half::setBits(phVar6 + local_30,(uint16_t)lVar4);
        Imf_3_4::Array2D<Imath_3_2::half>::operator[](in_RSI,(long)local_2c);
        bVar1 = Imath_3_2::half::isNan
                          ((half *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
        local_41 = true;
        if (!bVar1) {
          Imf_3_4::Array2D<Imath_3_2::half>::operator[](in_RSI,(long)local_2c);
          local_41 = Imath_3_2::half::isInfinity
                               ((half *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0
                                                ));
        }
      } while (local_41 != false);
      do {
        lVar4 = Imath_3_2::Rand48::nexti((Rand48 *)0x207ee4);
        pfVar7 = Imf_3_4::Array2D<float>::operator[](in_RDX,(long)local_2c);
        pfVar7[local_30] = (float)lVar4;
        pfVar7 = Imf_3_4::Array2D<float>::operator[](in_RDX,(long)local_2c);
        uVar2 = std::isnan((double)(ulong)(uint)pfVar7[local_30]);
        in_stack_ffffffffffffffb7 = 1;
        if ((uVar2 & 1) == 0) {
          pfVar7 = Imf_3_4::Array2D<float>::operator[](in_RDX,(long)local_2c);
          iVar3 = std::isinf((double)(ulong)(uint)pfVar7[local_30]);
          in_stack_ffffffffffffffb7 = (byte)iVar3;
        }
      } while ((in_stack_ffffffffffffffb7 & 1) != 0);
    }
  }
  return;
}

Assistant:

void
fillPixels4 (
    Array2D<unsigned int>& pi,
    Array2D<half>&         ph,
    Array2D<float>&        pf,
    int                    width,
    int                    height)
{
    cout << "random bits" << endl;

    //
    // Use of a union to extract the bit pattern from a float, as is
    // done below, works only if int and float have the same size.
    //

    assert (sizeof (int) == sizeof (float));

    Rand48 rand;

    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            pi[y][x] = rand.nexti ();

            do
            {
                ph[y][x].setBits (rand.nexti ());
            } while (ph[y][x].isNan () || ph[y][x].isInfinity ());

            union
            {
                int   i;
                float f;
            } u;

            do
            {
                u.i      = rand.nexti ();
                pf[y][x] = u.f;
            } while (isnan (pf[y][x]) || isinf (pf[y][x]));
        }
}